

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharGraph.cpp
# Opt level: O0

string * Hpipe::anon_unknown_19::left_shifted(string *__return_storage_ptr__,string *str)

{
  bool bVar1;
  istream *piVar2;
  unsigned_long *puVar3;
  long lVar4;
  char *__lhs;
  double dVar5;
  undefined1 auVar6 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f1;
  fpos<__mbstate_t> local_1f0;
  undefined4 local_1dc;
  unsigned_long local_1d8;
  size_type pos;
  string local_1c0 [8];
  string line;
  istringstream ss;
  unsigned_long local_20;
  size_type min_pos;
  string *str_local;
  string *res;
  
  local_20 = 1000000;
  min_pos = (size_type)str;
  str_local = __return_storage_ptr__;
  std::__cxx11::istringstream::istringstream((istringstream *)((long)&line.field_2 + 8),str,8);
  std::__cxx11::string::string(local_1c0);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(line.field_2._M_local_buf + 8),local_1c0);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    local_1d8 = std::__cxx11::string::find_first_not_of((char)local_1c0,0x20);
    if (local_1d8 != 0xffffffffffffffff) {
      puVar3 = std::min<unsigned_long>(&local_20,&local_1d8);
      local_20 = *puVar3;
    }
  }
  auVar6._8_4_ = (int)(local_20 >> 0x20);
  auVar6._0_8_ = local_20;
  auVar6._12_4_ = 0x45300000;
  dVar5 = (auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0);
  if ((dVar5 != 1000000.0) || (NAN(dVar5))) {
    std::ios::clear((long)&line.field_2 + *(long *)(line.field_2._8_8_ + -0x18) + 8,0);
    std::fpos<__mbstate_t>::fpos(&local_1f0,0);
    std::istream::seekg((undefined1 *)((long)&line.field_2 + 8),local_1f0._M_off,local_1f0._M_state)
    ;
    local_1f1 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(line.field_2._M_local_buf + 8),local_1c0);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
      if (!bVar1) break;
      lVar4 = std::__cxx11::string::find_first_not_of((char)local_1c0,0x20);
      if (lVar4 != -1) {
        lVar4 = std::__cxx11::string::size();
        __lhs = "";
        if (lVar4 != 0) {
          __lhs = "\n";
        }
        std::__cxx11::string::substr((ulong)&local_238,(ulong)local_1c0);
        std::operator+(&local_218,__lhs,&local_238);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
      }
    }
    local_1f1 = 1;
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)min_pos);
  }
  local_1dc = 1;
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::istringstream::~istringstream((istringstream *)(line.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string left_shifted( const std::string &str ) {
    std::string::size_type min_pos = 1e6;
    std::istringstream ss( str );
    std::string line;
    while( std::getline( ss, line ) ) {
        auto pos = line.find_first_not_of( ' ' );
        if ( pos != std::string::npos )
            min_pos = std::min( min_pos, pos );
    }
    if ( min_pos == 1e6 )
        return str;

    ss.clear();
    ss.seekg( 0 );
    std::string res;
    while( std::getline( ss, line ) ) {
        if ( line.find_first_not_of( ' ' ) != std::string::npos )
            res += ( res.size() ? "\n" : "" ) + line.substr( min_pos );
    }
    return res;
}